

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O0

void __thiscall
bloomfilter::BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8>::BloomFilter
          (BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8> *this,size_t n)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  int *in_RSI;
  undefined8 *in_RDI;
  unsigned_long *unaff_retaddr;
  SimpleMixSplit *in_stack_00001380;
  undefined8 *__n;
  
  __n = in_RDI;
  hashing::SimpleMixSplit::SimpleMixSplit(in_stack_00001380);
  in_RDI[1] = 0;
  sVar2 = getBestK((size_t)in_RDI);
  *(int *)(in_RDI + 4) = (int)sVar2;
  in_RDI[3] = (long)in_RSI * 0xc;
  in_RDI[2] = in_RDI[3] + 0x3f >> 6;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDI[2];
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *in_RDI = pvVar4;
  std::fill_n<unsigned_long*,unsigned_long,int>(unaff_retaddr,(unsigned_long)__n,in_RSI);
  return;
}

Assistant:

explicit BloomFilter(const size_t n) : hasher() {
    this->size = 0;
    this->kk = getBestK(bits_per_item);
    this->bitCount = n * bits_per_item;
    this->arrayLength = (bitCount + 63) / 64;
    data = new uint64_t[arrayLength];
    std::fill_n(data, arrayLength, 0);
  }